

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SSBOBarrierTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOBarrierTestInstance *this)

{
  VkAccessFlags *pVVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  TestStatus *pTVar3;
  Allocation *pAVar4;
  VkCommandPool obj;
  WriteDescriptorInfo *commandBuffer;
  pointer pVVar5;
  pointer pVVar6;
  int i;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  long lVar7;
  DescriptorSetLayoutBuilder *pDVar8;
  DescriptorPoolBuilder *pDVar9;
  DescriptorSetUpdateBuilder *pDVar10;
  const_iterator cVar11;
  ostream *poVar12;
  int accum;
  int iVar13;
  VkBufferMemoryBarrier writeUniformConstantsBarrier;
  WriteDescriptorInfo *local_448;
  long *plStack_440;
  pointer local_438;
  pointer pVStack_430;
  VkPipelineLayout local_428;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_420;
  TestStatus *local_408;
  VkQueue local_400;
  VkDescriptorSetLayout local_3f8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_3f0;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  Buffer outputBuffer;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_380;
  VkPipeline local_368;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_360;
  VkPipeline local_348;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_340;
  VkShaderModule local_328;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_320;
  VkShaderModule local_308;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_300;
  VkDescriptorPool local_2e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_2e0;
  Buffer uniformBuffer;
  ostringstream msg;
  WriteDescriptorInfo local_288;
  ios_base local_228 [272];
  VkDescriptorBufferInfo uniformBufferDescriptorInfo;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  VkDescriptorBufferInfo workBufferDescriptorInfo;
  Buffer workBuffer;
  VkBufferMemoryBarrier afterComputeBarrier;
  VkBufferMemoryBarrier betweenShadersBarrier;
  
  local_408 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_400 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar13 = 1;
  lVar7 = 0;
  do {
    iVar13 = iVar13 * (this->m_workSize).m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,(long)iVar13 << 2,0x20);
  compute::Buffer::Buffer
            (&workBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x0);
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,4,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  *(undefined4 *)
   (outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = 0;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,4,0x10);
  compute::Buffer::Buffer
            (&uniformBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  *(undefined4 *)
   (uniformBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr)->m_hostPtr = 0x7f;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((uniformBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (uniformBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  pDVar8 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     ((DescriptorSetLayoutBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
                      (VkSampler *)0x0);
  pDVar8 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  pDVar8 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&writeUniformConstantsBarrier,pDVar8,vk,device
             ,0);
  DStack_3f0.m_device = (VkDevice)writeUniformConstantsBarrier._16_8_;
  DStack_3f0.m_allocator = (VkAllocationCallbacks *)writeUniformConstantsBarrier._24_8_;
  local_3f8.m_internal = writeUniformConstantsBarrier._0_8_;
  DStack_3f0.m_deviceIface = (DeviceInterface *)writeUniformConstantsBarrier.pNext;
  writeUniformConstantsBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  writeUniformConstantsBarrier._4_4_ = 0;
  writeUniformConstantsBarrier.pNext = (void *)0x0;
  writeUniformConstantsBarrier.srcAccessMask = 0;
  writeUniformConstantsBarrier.dstAccessMask = 0;
  writeUniformConstantsBarrier.srcQueueFamilyIndex = 0;
  writeUniformConstantsBarrier.dstQueueFamilyIndex = 0;
  if ((pointer)local_288.bufferInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_288.bufferInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_288.texelBufferViews.
                          super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_288.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_288.imageInfos.
               super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_288.imageInfos.
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_288.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_288.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)_msg != (pointer)0x0) {
    operator_delete((void *)_msg,
                    (long)local_288.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start - _msg);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&writeUniformConstantsBarrier);
  pDVar9 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&writeUniformConstantsBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar9 = ::vk::DescriptorPoolBuilder::addType(pDVar9,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&msg,pDVar9,vk,device,1,1);
  DStack_2e0.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_2e0.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2e8.m_internal = _msg;
  _msg = 0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (writeUniformConstantsBarrier._0_8_ != 0) {
    operator_delete((void *)writeUniformConstantsBarrier._0_8_,
                    writeUniformConstantsBarrier._16_8_ - writeUniformConstantsBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&msg,vk,device,local_2e8,local_3f8);
  local_438 = (pointer)local_288.imageInfos.
                       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pVStack_430 = (pointer)local_288.imageInfos.
                         super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_448 = (WriteDescriptorInfo *)_msg;
  plStack_440 = (long *)0x0;
  uniformBufferDescriptorInfo.buffer.m_internal =
       uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  uniformBufferDescriptorInfo.offset = 0;
  uniformBufferDescriptorInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  pDVar10 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&msg,(int)local_448,(void *)0x0,0);
  pDVar10 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write(pDVar10,(int)local_448,&DAT_00000001,0);
  pDVar10 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar10,(int)local_448,(void *)((long)&lRam0000000000000000 + 2),0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar10,vk,device);
  if ((pointer)local_288.bufferInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_288.bufferInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_288.texelBufferViews.
                          super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_288.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_288.imageInfos.
               super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_288.imageInfos.
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_288.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_288.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&msg);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  pVVar1 = &writeUniformConstantsBarrier.srcAccessMask;
  writeUniformConstantsBarrier._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&writeUniformConstantsBarrier,"comp0","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)&writeUniformConstantsBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,
             *(ProgramBinary **)(cVar11._M_node + 2),0);
  DStack_300.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_300.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_308.m_internal = _msg;
  DStack_300.m_deviceIface = (DeviceInterface *)0x0;
  _msg = 0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((VkAccessFlags *)writeUniformConstantsBarrier._0_8_ != pVVar1) {
    operator_delete((void *)writeUniformConstantsBarrier._0_8_,
                    writeUniformConstantsBarrier._16_8_ + 1);
  }
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  writeUniformConstantsBarrier._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&writeUniformConstantsBarrier,"comp1","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)&writeUniformConstantsBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,
             *(ProgramBinary **)(cVar11._M_node + 2),0);
  DStack_320.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_320.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_328.m_internal = _msg;
  DStack_320.m_deviceIface = (DeviceInterface *)0x0;
  _msg = 0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((VkAccessFlags *)writeUniformConstantsBarrier._0_8_ != pVVar1) {
    operator_delete((void *)writeUniformConstantsBarrier._0_8_,
                    writeUniformConstantsBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&msg,vk,device,local_3f8);
  DStack_420.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_420.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_428.m_internal = _msg;
  DStack_420.m_deviceIface = (DeviceInterface *)0x0;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,_msg,local_308);
  DStack_340.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_340.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_348.m_internal = _msg;
  DStack_340.m_deviceIface = (DeviceInterface *)0x0;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,local_428,local_328);
  DStack_360.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_360.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_368.m_internal = _msg;
  DStack_360.m_deviceIface = (DeviceInterface *)0x0;
  makeBufferMemoryBarrier
            (&writeUniformConstantsBarrier,0x4000,8,
             (VkBuffer)
             uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  makeBufferMemoryBarrier
            (&betweenShadersBarrier,0x40,0x20,
             (VkBuffer)
             workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,(long)iVar13 << 2);
  makeBufferMemoryBarrier
            (&afterComputeBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&msg,vk,device,queueFamilyIndex);
  obj.m_internal = _msg;
  DStack_380.m_device =
       (VkDevice)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_380.m_allocator =
       (VkAllocationCallbacks *)
       local_288.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  DStack_380.m_deviceIface = (DeviceInterface *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&msg,vk,device,(VkCommandPool)_msg,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar6 = local_288.imageInfos.
           super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = local_288.imageInfos.
           super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  commandBuffer = (WriteDescriptorInfo *)_msg;
  beginCommandBuffer(vk,(VkCommandBuffer)_msg);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_348.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,local_428.m_internal,0,1,&local_448,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x4000,1,0,0,0,1,&writeUniformConstantsBarrier,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,commandBuffer,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x800,0x800,0,0,0,1,&betweenShadersBarrier,0,0);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_368.m_internal);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,commandBuffer,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x800,0x4000,0,0,0,1,&afterComputeBarrier,0,0)
  ;
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,local_400,(VkCommandBuffer)commandBuffer);
  pAVar4 = outputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  pTVar3 = local_408;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = iVar13 * 0x80 + (int)((ulong)(iVar13 - 2) * (ulong)(iVar13 - 1) >> 1) + -1;
  }
  if (*pAVar4->m_hostPtr == iVar13) {
    _msg = (deUint64)&local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Compute succeeded","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&pTVar3->m_description,_msg,_msg);
    if ((WriteDescriptorInfo *)_msg != &local_288) {
      operator_delete((void *)_msg,
                      (ulong)((long)&(((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                        *)&(local_288.imageInfos.
                                            super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->sampler)->
                                     super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&msg,"ERROR: comparison failed, expected ",0x23);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", got ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__cxx11::stringbuf::str();
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_3d8,local_3d0 + (long)local_3d8);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8,local_3c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    std::ios_base::~ios_base(local_228);
  }
  if (commandBuffer != (WriteDescriptorInfo *)0x0) {
    _msg = (deUint64)commandBuffer;
    (**(code **)(lRam0000000000000000 + 0x240))(0,pVVar5,pVVar6,1);
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_380,obj);
  }
  if (local_368.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_360,local_368);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_340,local_348);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_420,local_428);
  }
  if (local_328.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_320,local_328);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_300,local_308);
  }
  if (local_448 != (WriteDescriptorInfo *)0x0) {
    _msg = (deUint64)local_448;
    (**(code **)(*plStack_440 + 0x1e8))(plStack_440,local_438,pVStack_430,1);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (local_3f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_3f0,local_3f8);
  }
  if (uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (uniformBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(uniformBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    uniformBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr = (Allocation *)0x0;
  }
  if (outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (outputBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(outputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (workBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(workBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
       .m_data.ptr)->_vptr_Allocation[1])();
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus SSBOBarrierTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create a work buffer used by both shaders

	const int workGroupCount = multiplyComponents(m_workSize);
	const VkDeviceSize workBufferSizeBytes = sizeof(deUint32) * workGroupCount;
	const Buffer workBuffer(vk, device, allocator, makeBufferCreateInfo(workBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::Any);

	// Create an output buffer

	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32);
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Initialize atomic counter value to zero
	{
		const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
		deUint32* outputBufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
		*outputBufferPtr = 0;
		flushMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);
	}

	// Create a uniform buffer (to pass uniform constants)

	const VkDeviceSize uniformBufferSizeBytes = sizeof(deUint32);
	const Buffer uniformBuffer(vk, device, allocator, makeBufferCreateInfo(uniformBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Set the constants in the uniform buffer

	const deUint32	baseValue = 127;
	{
		const Allocation& uniformBufferAllocation = uniformBuffer.getAllocation();
		deUint32* uniformBufferPtr = static_cast<deUint32*>(uniformBufferAllocation.getHostPtr());
		uniformBufferPtr[0] = baseValue;

		flushMappedMemoryRange(vk, device, uniformBufferAllocation.getMemory(), uniformBufferAllocation.getOffset(), uniformBufferSizeBytes);
	}

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo workBufferDescriptorInfo = makeDescriptorBufferInfo(*workBuffer, 0ull, workBufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, outputBufferSizeBytes);
	const VkDescriptorBufferInfo uniformBufferDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, uniformBufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &workBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule0(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp0"), 0));
	const Unique<VkShaderModule> shaderModule1(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp1"), 0));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline0(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule0));
	const Unique<VkPipeline> pipeline1(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule1));

	const VkBufferMemoryBarrier writeUniformConstantsBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_UNIFORM_READ_BIT, *uniformBuffer, 0ull, uniformBufferSizeBytes);

	const VkBufferMemoryBarrier betweenShadersBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *workBuffer, 0ull, workBufferSizeBytes);

	const VkBufferMemoryBarrier afterComputeBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline0);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &writeUniformConstantsBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &betweenShadersBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	// Switch to the second shader program
	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline1);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &afterComputeBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32	res = *bufferPtr;
	deUint32		ref = 0;

	for (int ndx = 0; ndx < workGroupCount; ++ndx)
		ref += baseValue + ndx;

	if (res != ref)
	{
		std::ostringstream msg;
		msg << "ERROR: comparison failed, expected " << ref << ", got " << res;
		return tcu::TestStatus::fail(msg.str());
	}
	return tcu::TestStatus::pass("Compute succeeded");
}